

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O0

void __thiscall Edge::Dump(Edge *this,char *prefix)

{
  bool bVar1;
  undefined8 uVar2;
  reference ppNVar3;
  ulong uVar4;
  bool bVar5;
  __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_38;
  __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_30;
  const_iterator i_1;
  __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_20;
  const_iterator i;
  char *prefix_local;
  Edge *this_local;
  
  i._M_current = (Node **)prefix;
  printf("%s[ ",prefix);
  local_20._M_current = (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin(&this->inputs_)
  ;
  while( true ) {
    i_1 = std::vector<Node_*,_std::allocator<Node_*>_>::end(&this->inputs_);
    bVar1 = __gnu_cxx::operator!=(&local_20,&i_1);
    bVar5 = false;
    if (bVar1) {
      ppNVar3 = __gnu_cxx::
                __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                operator*(&local_20);
      bVar5 = *ppNVar3 != (Node *)0x0;
    }
    if (!bVar5) break;
    ppNVar3 = __gnu_cxx::
              __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
              operator*(&local_20);
    Node::path_abi_cxx11_(*ppNVar3);
    uVar2 = std::__cxx11::string::c_str();
    printf("%s ",uVar2);
    __gnu_cxx::__normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
    operator++(&local_20);
  }
  Rule::name_abi_cxx11_(this->rule_);
  uVar2 = std::__cxx11::string::c_str();
  printf("--%s-> ",uVar2);
  local_30._M_current =
       (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin(&this->outputs_);
  while( true ) {
    local_38._M_current =
         (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end(&this->outputs_);
    bVar1 = __gnu_cxx::operator!=(&local_30,&local_38);
    bVar5 = false;
    if (bVar1) {
      ppNVar3 = __gnu_cxx::
                __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                operator*(&local_30);
      bVar5 = *ppNVar3 != (Node *)0x0;
    }
    if (!bVar5) break;
    ppNVar3 = __gnu_cxx::
              __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
              operator*(&local_30);
    Node::path_abi_cxx11_(*ppNVar3);
    uVar2 = std::__cxx11::string::c_str();
    printf("%s ",uVar2);
    __gnu_cxx::__normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
    operator++(&local_30);
  }
  if (this->pool_ == (Pool *)0x0) {
    printf("(null pool?)");
  }
  else {
    Pool::name_abi_cxx11_(this->pool_);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      Pool::name_abi_cxx11_(this->pool_);
      uVar2 = std::__cxx11::string::c_str();
      printf("(in pool \'%s\')",uVar2);
    }
  }
  printf("] 0x%p\n",this);
  return;
}

Assistant:

void Edge::Dump(const char* prefix) const {
  printf("%s[ ", prefix);
  for (vector<Node*>::const_iterator i = inputs_.begin();
       i != inputs_.end() && *i != NULL; ++i) {
    printf("%s ", (*i)->path().c_str());
  }
  printf("--%s-> ", rule_->name().c_str());
  for (vector<Node*>::const_iterator i = outputs_.begin();
       i != outputs_.end() && *i != NULL; ++i) {
    printf("%s ", (*i)->path().c_str());
  }
  if (pool_) {
    if (!pool_->name().empty()) {
      printf("(in pool '%s')", pool_->name().c_str());
    }
  } else {
    printf("(null pool?)");
  }
  printf("] 0x%p\n", this);
}